

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

bool __thiscall SQCompiler::NeedGet(SQCompiler *this)

{
  long lVar1;
  bool bVar2;
  SQCompiler *in_RDI;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_1;
  
  lVar1 = in_RDI->_token;
  if ((((lVar1 == 0x28) || (lVar1 == 0x3d)) || (lVar1 == 0x119)) || (lVar1 - 0x121U < 2)) {
LAB_00120818:
    local_1 = false;
  }
  else {
    if (lVar1 - 0x12fU < 2) {
      bVar2 = IsEndOfStatement(in_RDI);
      if (!bVar2) {
        return false;
      }
    }
    else if (lVar1 - 0x13dU < 3) goto LAB_00120818;
    local_21 = true;
    if (((in_RDI->_es).donot_get & 1U) != 0) {
      local_22 = false;
      if (((in_RDI->_es).donot_get & 1U) != 0) {
        local_23 = true;
        if (in_RDI->_token != 0x2e) {
          local_23 = in_RDI->_token == 0x5b;
        }
        local_22 = local_23;
      }
      local_21 = local_22;
    }
    local_1 = local_21;
  }
  return local_1;
}

Assistant:

bool NeedGet()
    {
        switch(_token) {
        case _SC('='): case _SC('('): case TK_NEWSLOT: case TK_MODEQ: case TK_MULEQ:
        case TK_DIVEQ: case TK_MINUSEQ: case TK_PLUSEQ:
            return false;
        case TK_PLUSPLUS: case TK_MINUSMINUS:
            if (!IsEndOfStatement()) {
                return false;
            }
        break;
        }
        return (!_es.donot_get || ( _es.donot_get && (_token == _SC('.') || _token == _SC('['))));
    }